

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json(json *j,field<discordpp::MessageInteraction> *f)

{
  _Head_base<0UL,_discordpp::MessageInteraction_*,_false> _Var1;
  _Head_base<0UL,_discordpp::MessageInteraction_*,_false> this;
  pointer *__ptr;
  state sVar2;
  pointer __p;
  MessageInteraction *local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_> local_40 [3];
  unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_> local_28 [2];
  
  if (j->m_type == null) {
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
         .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
    .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl =
         (MessageInteraction *)0x0;
    sVar2 = nulled_e;
    if (_Var1._M_head_impl != (MessageInteraction *)0x0) {
      std::default_delete<discordpp::MessageInteraction>::operator()
                ((default_delete<discordpp::MessageInteraction> *)f,_Var1._M_head_impl);
    }
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::MessageInteraction,_0>(local_70,j);
    this._M_head_impl = (MessageInteraction *)operator_new(0x58);
    MessageInteraction::MessageInteraction(this._M_head_impl,(MessageInteraction *)local_70);
    local_78 = (MessageInteraction *)0x0;
    _Var1._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
         ._M_t.
         super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
         .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::MessageInteraction,_std::default_delete<discordpp::MessageInteraction>_>
    ._M_t.
    super__Tuple_impl<0UL,_discordpp::MessageInteraction_*,_std::default_delete<discordpp::MessageInteraction>_>
    .super__Head_base<0UL,_discordpp::MessageInteraction_*,_false>._M_head_impl = this._M_head_impl;
    if (_Var1._M_head_impl != (MessageInteraction *)0x0) {
      std::default_delete<discordpp::MessageInteraction>::operator()
                ((default_delete<discordpp::MessageInteraction> *)f,_Var1._M_head_impl);
    }
    if (local_78 != (MessageInteraction *)0x0) {
      std::default_delete<discordpp::MessageInteraction>::operator()
                ((default_delete<discordpp::MessageInteraction> *)&local_78,local_78);
    }
    local_78 = (MessageInteraction *)0x0;
    std::unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>::
    ~unique_ptr(local_28);
    std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr(local_40);
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_50._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50._M_head_impl);
    }
    local_50._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
    if ((_Tuple_impl<0UL,_discordpp::InteractionType_*,_std::default_delete<discordpp::InteractionType>_>
         )local_70._16_8_ != (InteractionType *)0x0) {
      operator_delete((void *)local_70._16_8_,4);
    }
    local_70._16_8_ =
         (_Tuple_impl<0UL,_discordpp::InteractionType_*,_std::default_delete<discordpp::InteractionType>_>
          )0x0;
    if ((_Head_base<0UL,_discordpp::Snowflake_*,_false>)local_70._0_8_ !=
        (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0) {
      operator_delete((void *)local_70._0_8_,8);
    }
    sVar2 = present_e;
  }
  f->s_ = sVar2;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }